

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,AssertStatement *ptr)

{
  allocator<char> local_39;
  string local_38;
  AssertStatement *local_18;
  AssertStatement *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (AssertStatement *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"assert",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  arrow(this,local_18,local_18->check);
  (**(local_18->check->super_Base)._vptr_Base)(local_18->check,this);
  return;
}

Assistant:

void gv_visitor::visit(AssertStatement* ptr) {
    box(ptr, "assert");
    arrow(ptr, ptr->check);
    ptr->check->accept(this);
}